

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseephemeron(global_State *g,Table *h,int inv)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  GCObject *local_50;
  Node *local_40;
  Node *n;
  int marked;
  uint nsize;
  uint i;
  int hasww;
  int hasclears;
  int inv_local;
  Table *h_local;
  global_State *g_local;
  
  bVar2 = false;
  bVar1 = false;
  uVar3 = 1 << (h->lsizenode & 0x1f);
  n._0_4_ = traversearray(g,h);
  for (marked = 0; (uint)marked < uVar3; marked = marked + 1) {
    if (inv == 0) {
      local_40 = h->node + (uint)marked;
    }
    else {
      local_40 = h->node + ((uVar3 - 1) - marked);
    }
    if (((local_40->u).tt_ & 0xf) == 0) {
      clearkey(local_40);
    }
    else {
      if (((local_40->u).key_tt & 0x40) == 0) {
        local_50 = (GCObject *)0x0;
      }
      else {
        local_50 = (local_40->u).key_val.gc;
      }
      iVar4 = iscleared(g,local_50);
      if (iVar4 == 0) {
        if ((((local_40->u).tt_ & 0x40) != 0) && ((((local_40->u).value_.gc)->marked & 0x18) != 0))
        {
          n._0_4_ = 1;
          reallymarkobject(g,(local_40->u).value_.gc);
        }
      }
      else {
        bVar2 = true;
        if ((((local_40->u).tt_ & 0x40) != 0) && ((((local_40->u).value_.gc)->marked & 0x18) != 0))
        {
          bVar1 = true;
        }
      }
    }
  }
  if (g->gcstate == '\0') {
    linkgclist_((GCObject *)h,&h->gclist,&g->grayagain);
  }
  else if (bVar1) {
    linkgclist_((GCObject *)h,&h->gclist,&g->ephemeron);
  }
  else if (bVar2) {
    linkgclist_((GCObject *)h,&h->gclist,&g->allweak);
  }
  else {
    genlink(g,(GCObject *)h);
  }
  return (int)n;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int nsize = sizenode(h);
  int marked = traversearray(g, h);  /* traverse array part */
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}